

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O0

void __thiscall
duckdb::RowGroupCollection::MergeStorage
          (RowGroupCollection *this,RowGroupCollection *data,
          optional_ptr<duckdb::DataTable,_true> table,
          optional_ptr<duckdb::StorageCommitState,_true> commit_state)

{
  long lVar1;
  bool bVar2;
  TableStatistics *this_00;
  __int_type _Var3;
  StorageCommitState *pSVar4;
  DataTable *pDVar5;
  __int_type *p_Var6;
  long in_RSI;
  long in_RDI;
  PersistentRowGroupData persistent_data;
  unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *row_group_1;
  SegmentNode<duckdb::RowGroup> *entry_1;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::SegmentNode<duckdb::RowGroup>,_true> *__range1;
  RowGroup *row_group;
  SegmentNode<duckdb::RowGroup> *entry;
  iterator __end2;
  iterator __begin2;
  vector<duckdb::SegmentNode<duckdb::RowGroup>,_true> *__range2;
  idx_t optimistically_written_count;
  unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>,_true>
  row_group_data;
  vector<duckdb::SegmentNode<duckdb::RowGroup>,_true> segments;
  unsigned_long index;
  unsigned_long start_index;
  memory_order __b_1;
  memory_order __b;
  value_type *in_stack_fffffffffffffe08;
  PersistentRowGroupData *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  RowGroup *in_stack_fffffffffffffe28;
  pointer pMVar7;
  idx_t in_stack_fffffffffffffe40;
  undefined7 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4f;
  RowGroup *in_stack_fffffffffffffe50;
  RowGroup *this_01;
  undefined1 local_140 [8];
  undefined1 local_138 [128];
  pointer local_b8;
  pointer local_b0;
  __normal_iterator<duckdb::SegmentNode<duckdb::RowGroup>_*,_std::vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>_>
  local_a8;
  tuple<std::atomic<bool>_*,_std::default_delete<std::atomic<bool>[]>_> local_a0;
  pointer local_88;
  undefined1 local_78 [24];
  long local_60;
  long local_58;
  long local_50;
  optional_ptr local_40 [16];
  __int_type local_30;
  memory_order local_28;
  int local_24;
  __int_type *local_20;
  element_type *local_18;
  memory_order local_10;
  int local_c;
  TableStatistics *local_8;
  
  this_01 = *(RowGroup **)(in_RDI + 0x40);
  this_00 = (TableStatistics *)(in_RDI + 0x10);
  local_c = 5;
  local_50 = in_RSI;
  local_8 = this_00;
  local_10 = ::std::operator&(memory_order_seq_cst,__memory_order_mask);
  if (local_c - 1U < 2) {
    local_18 = (this_00->stats_lock).internal.
               super___shared_ptr<std::mutex,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  else if (local_c == 5) {
    local_18 = (this_00->stats_lock).internal.
               super___shared_ptr<std::mutex,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  else {
    local_18 = (this_00->stats_lock).internal.
               super___shared_ptr<std::mutex,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  local_60 = (long)&(this_01->super_SegmentBase<duckdb::RowGroup>).start + (long)local_18;
  local_58 = local_60;
  shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->
            ((shared_ptr<duckdb::RowGroupSegmentTree,_true> *)in_stack_fffffffffffffe10);
  SegmentTree<duckdb::RowGroup,_true>::MoveSegments
            ((SegmentTree<duckdb::RowGroup,_true> *)
             CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48));
  unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>,_true>
  ::unique_ptr((unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>,_true>
                *)0xbb032d);
  local_88 = (pointer)0x0;
  bVar2 = duckdb::optional_ptr::operator_cast_to_bool(local_40);
  if (bVar2) {
    local_a0.super__Tuple_impl<0UL,_std::atomic<bool>_*,_std::default_delete<std::atomic<bool>[]>_>.
    super__Head_base<0UL,_std::atomic<bool>_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_std::atomic<bool>_*,_std::default_delete<std::atomic<bool>[]>_>)local_78;
    local_a8._M_current =
         (SegmentNode<duckdb::RowGroup> *)
         ::std::
         vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
         ::begin((vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                  *)in_stack_fffffffffffffe08);
    local_b0 = (pointer)::std::
                        vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                        ::end((vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                               *)in_stack_fffffffffffffe08);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<duckdb::SegmentNode<duckdb::RowGroup>_*,_std::vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>_>
                               *)in_stack_fffffffffffffe10,
                              (__normal_iterator<duckdb::SegmentNode<duckdb::RowGroup>_*,_std::vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>_>
                               *)in_stack_fffffffffffffe08), bVar2) {
      local_b8 = (pointer)__gnu_cxx::
                          __normal_iterator<duckdb::SegmentNode<duckdb::RowGroup>_*,_std::vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>_>
                          ::operator*(&local_a8);
      local_138._120_8_ =
           unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator*
                     ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
                      in_stack_fffffffffffffe10);
      bVar2 = RowGroup::IsPersistent(in_stack_fffffffffffffe28);
      if (!bVar2) break;
      _Var3 = ::std::__atomic_base::operator_cast_to_unsigned_long
                        ((__atomic_base<unsigned_long> *)
                         CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      local_88 = (pointer)((long)&local_88->block_pointer + _Var3);
      __gnu_cxx::
      __normal_iterator<duckdb::SegmentNode<duckdb::RowGroup>_*,_std::vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>_>
      ::operator++(&local_a8);
    }
    if (local_88 != (pointer)0x0) {
      make_uniq<duckdb::PersistentCollectionData>();
      unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>,_true>
      ::operator=((unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>,_true>
                   *)in_stack_fffffffffffffe10,
                  (unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>,_true>
                   *)in_stack_fffffffffffffe08);
      unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>,_true>
      ::~unique_ptr((unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>,_true>
                     *)0xbb04a4);
    }
  }
  local_138._104_8_ = local_78;
  local_138._96_8_ =
       ::std::
       vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
       ::begin((vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                *)in_stack_fffffffffffffe08);
  local_138._88_8_ =
       ::std::
       vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
       ::end((vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
              *)in_stack_fffffffffffffe08);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<duckdb::SegmentNode<duckdb::RowGroup>_*,_std::vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>_>
                             *)in_stack_fffffffffffffe10,
                            (__normal_iterator<duckdb::SegmentNode<duckdb::RowGroup>_*,_std::vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>_>
                             *)in_stack_fffffffffffffe08), bVar2) {
    local_138._80_8_ =
         __gnu_cxx::
         __normal_iterator<duckdb::SegmentNode<duckdb::RowGroup>_*,_std::vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>_>
         ::operator*((__normal_iterator<duckdb::SegmentNode<duckdb::RowGroup>_*,_std::vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>_>
                      *)(local_138 + 0x60));
    local_138._72_8_ = &((reference)local_138._80_8_)->node;
    unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
              ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
               in_stack_fffffffffffffe10);
    RowGroup::MoveToCollection
              (in_stack_fffffffffffffe50,
               (RowGroupCollection *)CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),
               in_stack_fffffffffffffe40);
    bVar2 = duckdb::optional_ptr::operator_cast_to_bool(local_40);
    if ((bVar2) && ((pointer)(local_60 - local_58) < local_88)) {
      unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
                 in_stack_fffffffffffffe10);
      RowGroup::SerializeRowGroupInfo(this_01);
      vector<duckdb::LogicalType,_true>::operator=
                (&in_stack_fffffffffffffe10->types,&in_stack_fffffffffffffe08->types);
      unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>,_true>
      ::operator->((unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>,_true>
                    *)in_stack_fffffffffffffe10);
      ::std::vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
      ::push_back((vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
                   *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      PersistentRowGroupData::~PersistentRowGroupData(in_stack_fffffffffffffe10);
    }
    unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
              ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
               in_stack_fffffffffffffe10);
    _Var3 = ::std::__atomic_base::operator_cast_to_unsigned_long
                      ((__atomic_base<unsigned_long> *)
                       CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    local_60 = local_60 + _Var3;
    shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->
              ((shared_ptr<duckdb::RowGroupSegmentTree,_true> *)in_stack_fffffffffffffe10);
    in_stack_fffffffffffffe50 = (RowGroup *)local_138;
    unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::unique_ptr
              ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
               in_stack_fffffffffffffe10,
               (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
               in_stack_fffffffffffffe08);
    SegmentTree<duckdb::RowGroup,_true>::AppendSegment
              ((SegmentTree<duckdb::RowGroup,_true> *)in_stack_fffffffffffffe50,
               (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
               CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48));
    unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::~unique_ptr
              ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)0xbb06bd
              );
    __gnu_cxx::
    __normal_iterator<duckdb::SegmentNode<duckdb::RowGroup>_*,_std::vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>_>
    ::operator++((__normal_iterator<duckdb::SegmentNode<duckdb::RowGroup>_*,_std::vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>_>
                  *)(local_138 + 0x60));
  }
  bVar2 = duckdb::optional_ptr::operator_cast_to_bool(local_40);
  if ((bVar2) && (local_88 != (pointer)0x0)) {
    pSVar4 = optional_ptr<duckdb::StorageCommitState,_true>::operator->
                       ((optional_ptr<duckdb::StorageCommitState,_true> *)in_stack_fffffffffffffe10)
    ;
    pDVar5 = optional_ptr<duckdb::DataTable,_true>::operator*
                       ((optional_ptr<duckdb::DataTable,_true> *)in_stack_fffffffffffffe10);
    lVar1 = local_58;
    pMVar7 = local_88;
    unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>,_true>
    ::unique_ptr((unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>,_true>
                  *)in_stack_fffffffffffffe10,
                 (unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>,_true>
                  *)in_stack_fffffffffffffe08);
    (*pSVar4->_vptr_StorageCommitState[4])(pSVar4,pDVar5,lVar1,pMVar7,local_140);
    unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>,_true>
    ::~unique_ptr((unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>,_true>
                   *)0xbb07b1);
  }
  TableStatistics::MergeStats(this_00,(TableStatistics *)this_01);
  p_Var6 = (__int_type *)(local_50 + 0x10);
  local_24 = 5;
  local_20 = p_Var6;
  local_28 = ::std::operator&(memory_order_seq_cst,__memory_order_mask);
  if (local_24 - 1U < 2) {
    local_30 = *p_Var6;
  }
  else if (local_24 == 5) {
    local_30 = *p_Var6;
  }
  else {
    local_30 = *p_Var6;
  }
  ::std::__atomic_base<unsigned_long>::operator+=
            ((__atomic_base<unsigned_long> *)(in_RDI + 0x10),local_30);
  unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>,_true>
  ::~unique_ptr((unique_ptr<duckdb::PersistentCollectionData,_std::default_delete<duckdb::PersistentCollectionData>,_true>
                 *)0xbb08b5);
  vector<duckdb::SegmentNode<duckdb::RowGroup>,_true>::~vector
            ((vector<duckdb::SegmentNode<duckdb::RowGroup>,_true> *)0xbb08c2);
  return;
}

Assistant:

void RowGroupCollection::MergeStorage(RowGroupCollection &data, optional_ptr<DataTable> table,
                                      optional_ptr<StorageCommitState> commit_state) {
	D_ASSERT(data.types == types);
	auto start_index = row_start + total_rows.load();
	auto index = start_index;
	auto segments = data.row_groups->MoveSegments();

	// check if the row groups we are merging are optimistically written
	// if all row groups are optimistically written we keep around the block pointers
	unique_ptr<PersistentCollectionData> row_group_data;
	idx_t optimistically_written_count = 0;
	if (commit_state) {
		for (auto &entry : segments) {
			auto &row_group = *entry.node;
			if (!row_group.IsPersistent()) {
				break;
			}
			optimistically_written_count += row_group.count;
		}
		if (optimistically_written_count > 0) {
			row_group_data = make_uniq<PersistentCollectionData>();
		}
	}
	for (auto &entry : segments) {
		auto &row_group = entry.node;
		row_group->MoveToCollection(*this, index);

		if (commit_state && (index - start_index) < optimistically_written_count) {
			// serialize the block pointers of this row group
			auto persistent_data = row_group->SerializeRowGroupInfo();
			persistent_data.types = types;
			row_group_data->row_group_data.push_back(std::move(persistent_data));
		}
		index += row_group->count;
		row_groups->AppendSegment(std::move(row_group));
	}
	if (commit_state && optimistically_written_count > 0) {
		// if we have serialized the row groups - push the serialized block pointers into the commit state
		commit_state->AddRowGroupData(*table, start_index, optimistically_written_count, std::move(row_group_data));
	}
	stats.MergeStats(data.stats);
	total_rows += data.total_rows.load();
}